

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

void __thiscall ot::commissioner::DtlsSession::FreeMbedtls(DtlsSession *this)

{
  mbedtls_pk_free(&this->mOwnKey);
  mbedtls_x509_crt_free(&this->mOwnCert);
  mbedtls_x509_crt_free(&this->mCaChain);
  mbedtls_ssl_free(&this->mSsl);
  mbedtls_entropy_free(&this->mEntropy);
  mbedtls_ctr_drbg_free(&this->mCtrDrbg);
  mbedtls_ssl_cookie_free(&this->mCookie);
  mbedtls_ssl_config_free(&this->mConfig);
  return;
}

Assistant:

void DtlsSession::FreeMbedtls()
{
    mbedtls_pk_free(&mOwnKey);
    mbedtls_x509_crt_free(&mOwnCert);
    mbedtls_x509_crt_free(&mCaChain);

    mbedtls_ssl_free(&mSsl);
    mbedtls_entropy_free(&mEntropy);
    mbedtls_ctr_drbg_free(&mCtrDrbg);
    mbedtls_ssl_cookie_free(&mCookie);
    mbedtls_ssl_config_free(&mConfig);
}